

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedEofInputStream::tryRead
          (DelayedEofInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  AsyncInputStream *pAVar1;
  PromiseNode *extraout_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  Promise<unsigned_long> PVar2;
  DelayedEofInputStream *pDVar3;
  void *local_50;
  size_t local_48;
  Type local_40;
  undefined8 local_30;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  DelayedEofInputStream *this_local;
  
  pDVar3 = this;
  local_30 = in_R8;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  pAVar1 = Own<kj::AsyncInputStream>::operator->((Own<kj::AsyncInputStream> *)((long)buffer + 8));
  (*pAVar1->_vptr_AsyncInputStream[1])
            (&local_40,pAVar1,minBytes_local,maxBytes_local,local_30,in_R9,pDVar3,buffer);
  local_48 = maxBytes_local;
  local_50 = buffer;
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::_::PropagateException>
            ((Promise<unsigned_long> *)this,&local_40,(PropagateException *)&local_50);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_40);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)pDVar3;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
      return inner->tryRead(buffer, minBytes, maxBytes)
          .then([this, minBytes](size_t amount) -> kj::Promise<size_t> {
        if (amount < minBytes) {
          // Must have reached EOF.
          KJ_IF_MAYBE(t, completionTask) {
            // Delay until completion.
            auto result = t->then([amount]() { return amount; });
            completionTask = nullptr;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return amount;
          }
        } else {
          return amount;
        }
      });
    }